

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall wasm::WasmBinaryWriter::writeStart(WasmBinaryWriter *this)

{
  BufferWithRandomAccess *this_00;
  bool bVar1;
  uint32_t value;
  string_view local_28;
  U32LEB local_18;
  int32_t local_14;
  WasmBinaryWriter *pWStack_10;
  int32_t start;
  WasmBinaryWriter *this_local;
  
  pWStack_10 = this;
  bVar1 = IString::is(&(this->wasm->start).super_IString);
  if (bVar1) {
    local_14 = startSection<wasm::BinaryConsts::Section>(this,Start);
    this_00 = this->o;
    wasm::Name::Name((Name *)&local_28,(this->wasm->start).super_IString.str);
    value = getFunctionIndex(this,(Name)local_28);
    LEB<unsigned_int,_unsigned_char>::LEB(&local_18,value);
    BufferWithRandomAccess::operator<<(this_00,local_18);
    finishSection(this,local_14);
  }
  return;
}

Assistant:

void WasmBinaryWriter::writeStart() {
  if (!wasm->start.is()) {
    return;
  }
  auto start = startSection(BinaryConsts::Section::Start);
  o << U32LEB(getFunctionIndex(wasm->start.str));
  finishSection(start);
}